

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall runtime::VirtualMachine::JumpIfFalse(VirtualMachine *this)

{
  element_type *peVar1;
  bool bVar2;
  size_t sVar3;
  Variable VVar4;
  Variable var;
  
  VVar4 = popOpStack(this);
  var.field_1 = VVar4.field_1;
  var._4_4_ = 0;
  var.type = VVar4.type;
  bVar2 = booleanValueOfVariable(this,var);
  if (bVar2) {
    peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar1->programCounter = peVar1->programCounter + 1;
  }
  else {
    sVar3 = getByteCodeParameter(this);
    ((this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ->programCounter = sVar3;
  }
  return;
}

Assistant:

void runtime::VirtualMachine::JumpIfFalse() {
  Variable top{this->popOpStack()};

  if (!this->booleanValueOfVariable(top)) {
    this->Jump();
  } else {
    this->advance();
  }
}